

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool __thiscall cmDependsFortran::LocateModules(cmDependsFortran *this)

{
  uint uVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  _Rb_tree_header *p_Var3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  cmDependsFortranInternals *pcVar7;
  string *psVar8;
  pointer filename;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string fname;
  string targetDir;
  cmList infoFiles;
  ifstream fin;
  bool local_301;
  long *local_300;
  undefined8 local_2f8;
  long local_2f0 [2];
  string local_2e0;
  string *local_2c0;
  string local_2b8;
  long *local_298;
  undefined8 local_290;
  undefined8 local_288;
  char *local_280;
  undefined8 local_278;
  string local_270;
  cmList local_250;
  undefined1 local_238 [32];
  uint auStack_218 [122];
  
  pcVar7 = (this->Internal)._M_t.
           super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
           .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
  p_Var6 = *(_Base_ptr *)((long)&(pcVar7->ObjectInfo)._M_t + 0x18);
  p_Var3 = (_Rb_tree_header *)((long)&(pcVar7->ObjectInfo)._M_t + 8);
  if ((_Rb_tree_header *)p_Var6 != p_Var3) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)(this->Internal)._M_t.
                    super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                    .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl,
                 p_Var6[3]._M_right,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&p_Var6[3]._M_parent);
      for (p_Var5 = p_Var6[5]._M_parent; p_Var5 != (_Rb_tree_node_base *)&p_Var6[4]._M_right;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->Internal)._M_t.
                                super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                                .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>.
                               _M_head_impl)->TargetRequires,(key_type *)(p_Var5 + 1));
        pmVar4->_M_string_length = 0;
        *(pmVar4->_M_dataplus)._M_p = '\0';
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var3);
    pcVar7 = (this->Internal)._M_t.
             super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
             .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
  }
  if (*(size_t *)((long)&(pcVar7->TargetRequires)._M_t._M_impl + 0x28) == 0) {
    local_301 = true;
  }
  else {
    MatchLocalModules(this);
    this_00 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator.Makefile;
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,"CMAKE_Fortran_TARGET_LINKED_INFO_FILES","");
    psVar8 = (string *)cmMakefile::GetDefinition(this_00,&local_2b8);
    if (psVar8 == (string *)0x0) {
      psVar8 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar2 = (psVar8->_M_dataplus)._M_p;
    local_238._0_8_ = local_238 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,pcVar2,pcVar2 + psVar8->_M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)local_238;
    cmList::cmList(&local_250,init);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    local_2c0 = local_250.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_250.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_250.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_301 = true;
    }
    else {
      filename = local_250.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::GetFilenamePath(&local_2e0,filename);
        local_300 = local_2f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_300,local_2e0._M_dataplus._M_p,
                   local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
        std::__cxx11::string::append((char *)&local_300);
        std::ifstream::ifstream(local_238,(char *)local_300,_S_in);
        uVar1 = *(uint *)((long)auStack_218 + *(long *)(local_238._0_8_ + -0x18));
        local_301 = (uVar1 & 5) == 0;
        if (local_301) {
          MatchRemoteModules(this,(istream *)local_238,&local_2e0);
        }
        else {
          local_2b8._M_dataplus._M_p = (pointer)0x20;
          local_2b8._M_string_length = 0x8e31d3;
          local_2b8.field_2._M_allocated_capacity = 0;
          local_2b8.field_2._8_8_ = local_2f8;
          local_298 = local_300;
          local_290 = 0;
          local_288 = 0x17;
          local_280 = " for module information";
          local_278 = 0;
          views._M_len = 3;
          views._M_array = (iterator)&local_2b8;
          cmCatViews(&local_270,views);
          cmSystemTools::Error(&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
        }
        std::ifstream::~ifstream(local_238);
        if (local_300 != local_2f0) {
          operator_delete(local_300,local_2f0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
      } while (((uVar1 & 5) == 0) && (filename = filename + 1, filename != local_2c0));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_250.Values);
  }
  return local_301;
}

Assistant:

bool cmDependsFortran::LocateModules()
{
  // Collect the set of modules provided and required by all sources.
  using ObjectInfoMap = cmDependsFortranInternals::ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& infoI : objInfo) {
    cmFortranSourceInfo const& info = infoI.second;
    // Include this module in the set provided by this target.
    this->Internal->TargetProvides.insert(info.Provides.begin(),
                                          info.Provides.end());

    for (std::string const& r : info.Requires) {
      this->Internal->TargetRequires[r].clear();
    }
  }

  // Short-circuit for simple targets.
  if (this->Internal->TargetRequires.empty()) {
    return true;
  }

  // Match modules provided by this target to those it requires.
  this->MatchLocalModules();

  // Load information about other targets.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  cmList infoFiles{ mf->GetDefinition(
    "CMAKE_Fortran_TARGET_LINKED_INFO_FILES") };
  for (auto const& i : infoFiles) {
    std::string targetDir = cmSystemTools::GetFilenamePath(i);
    std::string fname = targetDir + "/fortran.internal";
    cmsys::ifstream fin(fname.c_str());
    if (!fin) {
      cmSystemTools::Error(cmStrCat("-E cmake_depends failed to open ", fname,
                                    " for module information"));
      return false;
    }
    this->MatchRemoteModules(fin, targetDir);
  }

  // TODO: Use `CMAKE_Fortran_TARGET_FORWARD_LINKED_INFO_FILES` to handle cases
  // described in #25425. Note that because Makefiles generators do not
  // implement relaxed object compilation as described in #15555, the issues
  // never actually cause build failures; only incremental build incorrectness.

  return true;
}